

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringExtras.cpp
# Opt level: O0

void __thiscall llvm::printEscapedString(llvm *this,StringRef Name,raw_ostream *Out)

{
  byte C_00;
  bool bVar1;
  char cVar2;
  raw_ostream *prVar3;
  uint uStack_2c;
  uchar C;
  uint e;
  uint i;
  raw_ostream *Out_local;
  StringRef Name_local;
  
  Name_local.Data = Name.Data;
  Name_local.Length = (size_t)&Out_local;
  Out_local = (raw_ostream *)this;
  for (uStack_2c = 0; uStack_2c != (uint)Name.Data; uStack_2c = uStack_2c + 1) {
    C_00 = StringRef::operator[]((StringRef *)&Out_local,(ulong)uStack_2c);
    bVar1 = isPrint(C_00);
    if (((bVar1) && (C_00 != 0x5c)) && (C_00 != 0x22)) {
      raw_ostream::operator<<((raw_ostream *)Name.Length,C_00);
    }
    else {
      prVar3 = raw_ostream::operator<<((raw_ostream *)Name.Length,'\\');
      cVar2 = hexdigit((int)(uint)C_00 >> 4,false);
      prVar3 = raw_ostream::operator<<(prVar3,cVar2);
      cVar2 = hexdigit(C_00 & 0xf,false);
      raw_ostream::operator<<(prVar3,cVar2);
    }
  }
  return;
}

Assistant:

void llvm::printEscapedString(StringRef Name, raw_ostream &Out) {
  for (unsigned i = 0, e = Name.size(); i != e; ++i) {
    unsigned char C = Name[i];
    if (isPrint(C) && C != '\\' && C != '"')
      Out << C;
    else
      Out << '\\' << hexdigit(C >> 4) << hexdigit(C & 0x0F);
  }
}